

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  void *outChannels;
  string *psVar4;
  bool bVar5;
  LogMessage *pLVar6;
  iterator iVar7;
  mapped_type_conflict1 *pmVar8;
  LayerUnion LVar9;
  WeightParams *pWVar10;
  long *plVar11;
  unsigned_long *puVar12;
  size_type *psVar13;
  uint uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  uint64_t expectedUnits;
  int i;
  int iVar17;
  string err;
  Result r;
  string err_1;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [40];
  string local_50;
  
  Result::Result((Result *)&local_b0);
  validateInputCount((Result *)local_88,layer,0,0);
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_88;
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
  pcVar2 = local_78 + 8;
  if (local_80._M_p != pcVar2) {
    operator_delete(local_80._M_p,local_78._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_b0);
  if (bVar5) {
    validateOutputCount((Result *)local_88,layer,1,1);
    local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
    if (local_80._M_p != pcVar2) {
      operator_delete(local_80._M_p,local_78._8_8_ + 1);
    }
  }
  bVar5 = Result::good((Result *)&local_b0);
  if (bVar5) {
    if (this->ndArrayInterpretation == true) {
      if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar6 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar6);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(this->blobNameToRank)._M_t,
                     (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header) {
        if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar6 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar6);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
        }
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,
                      (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        iVar17 = *pmVar8;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"LoadConstant","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"output","");
        checkRank((Result *)local_88,layer,&local_d0,5,5,&local_50,iVar17);
        local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88;
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
        if (local_80._M_p != pcVar2) {
          operator_delete(local_80._M_p,local_78._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good((Result *)&local_b0);
        if (!bVar5) goto LAB_0052b991;
      }
    }
    if (layer->_oneof_case_[0] == 0x122) {
      LVar9 = layer->layer_;
    }
    else {
      LVar9.loadconstant_ = Specification::LoadConstantLayerParams::default_instance();
    }
    pWVar10 = (LVar9.batchnorm_)->variance_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    bVar5 = 0 < (pWVar10->floatvalue_).current_size_;
    uVar14 = bVar5 + 1;
    if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
      uVar14 = (uint)bVar5;
    }
    if (((uVar14 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
      if (((LVar9.convolution_)->kernelsize_).current_size_ == 3) {
        expectedUnits = 1;
        iVar17 = 0;
        do {
          puVar12 = google::protobuf::RepeatedField<unsigned_long>::Get
                              (&(LVar9.convolution_)->kernelsize_,iVar17);
          expectedUnits = expectedUnits * *puVar12;
          iVar17 = iVar17 + 1;
          iVar3 = ((LVar9.convolution_)->kernelsize_).current_size_;
        } while (iVar17 < iVar3);
        if ((iVar3 == 3) &&
           (outChannels = ((LVar9.innerproduct_)->bias_->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          .ptr_, (void *)0x1 < outChannels)) {
          pWVar10 = (LVar9.batchnorm_)->variance_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"LoadConstant","");
          psVar4 = (layer->name_).ptr_;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"constants","");
          validateGeneralWeightParams
                    ((Result *)local_88,pWVar10,expectedUnits,(uint64_t)outChannels,&local_d0,psVar4
                     ,&local_50);
          local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_88;
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
          if (local_80._M_p != local_78 + 8) {
            operator_delete(local_80._M_p,local_78._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0052b94a:
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pWVar10 = (LVar9.batchnorm_)->variance_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"LoadConstant","");
          psVar4 = (layer->name_).ptr_;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"constants","");
          validateGeneralWeightParams
                    ((Result *)local_88,pWVar10,expectedUnits,1,&local_d0,psVar4,&local_50);
          local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_88;
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
          if (local_80._M_p != local_78 + 8) {
            operator_delete(local_80._M_p,local_78._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0052b94a;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good((Result *)&local_b0);
        if (bVar5) {
          Result::Result(__return_storage_ptr__);
          goto LAB_0052ba44;
        }
        goto LAB_0052b991;
      }
      std::operator+(&local_d0,"Load constant layer \'",(layer->name_).ptr_);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_d0);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_78._0_8_ = *psVar13;
        local_78._8_8_ = plVar11[3];
        local_88 = (undefined1  [8])local_78;
      }
      else {
        local_78._0_8_ = *psVar13;
        local_88 = (undefined1  [8])*plVar11;
      }
      local_80._M_p = (pointer)plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
      uVar15 = local_78._0_8_;
      _Var16._M_p = (pointer)local_88;
      if (local_88 == (undefined1  [8])local_78) goto LAB_0052ba44;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "Load constant layer \'",(layer->name_).ptr_);
      plVar11 = (long *)std::__cxx11::string::append(local_88);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_d0.field_2._M_allocated_capacity = *psVar13;
        local_d0.field_2._8_8_ = plVar11[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar13;
        local_d0._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_d0._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_88 != (undefined1  [8])local_78) {
        operator_delete((void *)local_88,local_78._0_8_ + 1);
      }
      Result::Result((Result *)local_88,INVALID_MODEL_PARAMETERS,&local_d0);
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
      if (local_80._M_p != pcVar2) {
        operator_delete(local_80._M_p,local_78._8_8_ + 1);
      }
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)__return_storage_ptr__ = local_b0;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p == &local_98) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_98._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_a8._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_a0;
      local_a0 = 0;
      local_98._M_local_buf[0] = '\0';
      uVar15 = local_d0.field_2._M_allocated_capacity;
      _Var16._M_p = local_d0._M_dataplus._M_p;
      local_a8._M_p = (pointer)&local_98;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0052ba44;
    }
    operator_delete(_Var16._M_p,uVar15 + 1);
  }
  else {
LAB_0052b991:
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)__return_storage_ptr__ = local_b0;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p == &local_98) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_98._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_a8._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_a0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_a8._M_p = (pointer)&local_98;
  }
LAB_0052ba44:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,
                    CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            int rank = blobNameToRank.at(layer.output(0));
            r = checkRank(layer, "LoadConstant", 5, 5, "output", rank);
            if (!r.good()) {return r;}
        }
    }

    const auto& params = layer.loadconstant();
    WeightParamType paramType = valueType(params.data());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Load constant layer '" + layer.name() + "' has both full precision and half precision weight fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.shape_size() != 3) {
        std::string err = "Load constant layer '" + layer.name() + "' must be a 3D constant.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.data(), total_shape, params.shape(0), "LoadConstant", layer.name(), "constants");
    } else {
        r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstant", layer.name(), "constants");
    }

    if (!r.good()) return r;

    return Result();
}